

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBCopyYToAlphaRow_C(uint8_t *src,uint8_t *dst,int width)

{
  long lVar1;
  
  for (lVar1 = 0; (int)lVar1 < width + -1; lVar1 = lVar1 + 2) {
    dst[lVar1 * 4 + 3] = src[lVar1];
    dst[lVar1 * 4 + 7] = src[lVar1 + 1];
  }
  if ((width & 1U) != 0) {
    dst[lVar1 * 4 + 3] = src[lVar1];
  }
  return;
}

Assistant:

void ARGBCopyYToAlphaRow_C(const uint8_t* src, uint8_t* dst, int width) {
  int i;
  for (i = 0; i < width - 1; i += 2) {
    dst[3] = src[0];
    dst[7] = src[1];
    dst += 8;
    src += 2;
  }
  if (width & 1) {
    dst[3] = src[0];
  }
}